

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<Qt::TimerId,Qt::TimerId>
                    (QList<Qt::TimerId> *vector,TimerId *u,qsizetype from)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  
  uVar2 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar2;
    if ((long)(from + uVar2) < 1) {
      uVar4 = 0;
    }
  }
  qVar6 = -1;
  if (uVar4 < uVar2) {
    lVar5 = uVar4 * 4 + -4;
    do {
      if (uVar2 * -4 + lVar5 == -4) {
        return -1;
      }
      lVar1 = lVar5 + 4;
      lVar3 = lVar5 + 4;
      lVar5 = lVar1;
    } while (*(TimerId *)((long)(vector->d).ptr + lVar3) != *u);
    qVar6 = lVar1 >> 2;
  }
  return qVar6;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }